

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_forest.cpp
# Opt level: O2

int main(void)

{
  run_dataset<mnist>(0x10,8,0x10,0x10);
  run_dataset<sift>(0x10,8,0x20,0x40);
  return 0;
}

Assistant:

int main() {
  // forest_max_leaf_size = 16
  // forest_max_leaves_visited = 16
  //    forest_size 8: a precision of around 0.915.
  //    forest_size 16: a precision of around 0.976.
  run_dataset<mnist>(16, 8, 16, 16);
  // forest_max_leaf_size = 32
  // forest_max_leaves_visited = 64
  //    forest_size 8: a precision of around 0.884.
  //    forest_size 16: a precision of around 0.940.
  //    forest_size 128: out of memory :'(
  run_dataset<sift>(16, 8, 32, 64);
  return 0;
}